

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

int Abc_NtkDarBmcInter(Abc_Ntk_t *pNtk,Inter_ManParams_t *pPars,Abc_Ntk_t **ppNtkRes)

{
  int iVar1;
  Aig_Man_t *in_RAX;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar2;
  Aig_Man_t *pManNew;
  
  if (ppNtkRes != (Abc_Ntk_t **)0x0) {
    *ppNtkRes = (Abc_Ntk_t *)0x0;
  }
  pAVar2 = pNtk;
  pManNew = in_RAX;
  pMan = Abc_NtkToDar(pNtk,0,1);
  if (pMan == (Aig_Man_t *)0x0) {
    Abc_Print((int)pAVar2,"Converting miter into AIG has failed.\n");
    iVar1 = -1;
  }
  else {
    if ((ppNtkRes == (Abc_Ntk_t **)0x0) || (pPars->fUseSeparate == 0)) {
      iVar1 = Abc_NtkDarBmcInter_int(pMan,pPars,(Aig_Man_t **)0x0);
    }
    else {
      iVar1 = Abc_NtkDarBmcInter_int(pMan,pPars,&pManNew);
      pAVar2 = Abc_NtkFromAigPhase(pManNew);
      *ppNtkRes = pAVar2;
      Aig_ManStop(pManNew);
    }
    if (pNtk->pModel != (int *)0x0) {
      free(pNtk->pModel);
      pNtk->pModel = (int *)0x0;
    }
    free(pNtk->pSeqModel);
    pNtk->pSeqModel = pMan->pSeqModel;
    pMan->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pMan);
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarBmcInter( Abc_Ntk_t * pNtk, Inter_ManParams_t * pPars, Abc_Ntk_t ** ppNtkRes )
{
    Aig_Man_t * pMan;
    int RetValue;
    if ( ppNtkRes )
        *ppNtkRes = NULL;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    if ( pPars->fUseSeparate && ppNtkRes )
    {
        Aig_Man_t * pManNew;
        RetValue = Abc_NtkDarBmcInter_int( pMan, pPars, &pManNew );
        *ppNtkRes = Abc_NtkFromAigPhase( pManNew );
        Aig_ManStop( pManNew );
    }
    else
    {
        RetValue = Abc_NtkDarBmcInter_int( pMan, pPars, NULL );
    }
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}